

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

LY_ERR ly_pattern_code_match(pcre2_code_8 *pcode,char *str,size_t str_len,ly_err_item **err)

{
  int iVar1;
  long lVar2;
  undefined1 local_148 [8];
  PCRE2_UCHAR8 pcre2_errmsg [256];
  pcre2_match_data_8 *match_data;
  int match_opts;
  int r;
  ly_err_item **err_local;
  size_t str_len_local;
  char *str_local;
  pcre2_code_8 *pcode_local;
  
  lVar2 = pcre2_match_data_create_from_pattern_8(pcode,0);
  if (lVar2 == 0) {
    pcode_local._4_4_ =
         ly_err_new(err,LY_EMEM,LYVE_SUCCESS,(char *)0x0,(char *)0x0,"Memory allocation failed.");
  }
  else {
    iVar1 = pcre2_match_8(pcode,str,str_len,0,0xa0000000,lVar2,0);
    pcre2_match_data_free_8(lVar2);
    if ((iVar1 == -1) || (-1 < iVar1)) {
      pcode_local._4_4_ = LY_SUCCESS;
      if (iVar1 == -1) {
        pcode_local._4_4_ = LY_ENOT;
      }
    }
    else {
      memset(local_148,0,0x100);
      pcre2_get_error_message_8(iVar1,local_148,0x100);
      pcode_local._4_4_ =
           ly_err_new(err,LY_ESYS,LYVE_SUCCESS,(char *)0x0,(char *)0x0,"%s",local_148);
    }
  }
  return pcode_local._4_4_;
}

Assistant:

LY_ERR
ly_pattern_code_match(pcre2_code *pcode, const char *str, size_t str_len, struct ly_err_item **err)
{
    int r, match_opts;
    pcre2_match_data *match_data = NULL;

    /* match_data needs to be allocated each time because of possible multi-threaded evaluation */
    match_data = pcre2_match_data_create_from_pattern(pcode, NULL);
    if (!match_data) {
        return ly_err_new(err, LY_EMEM, 0, NULL, NULL, LY_EMEM_MSG);
    }

    match_opts = PCRE2_ANCHORED;
#ifdef PCRE2_ENDANCHORED
    /* PCRE2_ENDANCHORED was added in PCRE2 version 10.30 */
    match_opts |= PCRE2_ENDANCHORED;
#endif
    r = pcre2_match(pcode, (PCRE2_SPTR)str, str_len, 0, match_opts, match_data, NULL);
    pcre2_match_data_free(match_data);

    if ((r != PCRE2_ERROR_NOMATCH) && (r < 0)) {
        PCRE2_UCHAR pcre2_errmsg[LY_PCRE2_MSG_LIMIT] = {0};

        pcre2_get_error_message(r, pcre2_errmsg, LY_PCRE2_MSG_LIMIT);
        return ly_err_new(err, LY_ESYS, 0, NULL, NULL, "%s", (const char *)pcre2_errmsg);
    }

    return (r == PCRE2_ERROR_NOMATCH) ? LY_ENOT : LY_SUCCESS;
}